

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# field_impl.h
# Opt level: O2

void secp256k1_fe_inv_var(secp256k1_fe *r,secp256k1_fe *x)

{
  secp256k1_fe *r_00;
  int64_t iVar1;
  int64_t iVar2;
  int iVar3;
  uint uVar4;
  ulong uVar5;
  byte bVar6;
  int iVar7;
  secp256k1_modinv64_modinfo *psVar8;
  ulong uVar9;
  undefined8 uVar10;
  long lVar11;
  char *pcVar12;
  secp256k1_modinv64_modinfo *extraout_RDX;
  secp256k1_modinv64_modinfo *extraout_RDX_00;
  secp256k1_modinv64_modinfo *extraout_RDX_01;
  int iVar13;
  long lVar14;
  int iVar15;
  ulong uVar16;
  ulong uVar17;
  char *pcVar18;
  long lVar19;
  int iVar20;
  long lVar21;
  int local_1ac;
  long local_1a8;
  long local_1a0;
  ulong local_188;
  long local_180;
  secp256k1_fe *local_178 [2];
  secp256k1_modinv64_signed62 f;
  secp256k1_modinv64_signed62 g;
  secp256k1_modinv64_trans2x2 local_108;
  secp256k1_modinv64_signed62 d;
  secp256k1_modinv64_signed62 local_b8;
  secp256k1_modinv64_signed62 local_90;
  secp256k1_fe tmp;
  
  local_178[1] = r;
  iVar3 = secp256k1_fe_normalizes_to_zero(x);
  secp256k1_fe_verify(x);
  tmp.n[0] = x->n[0];
  tmp.n[1] = x->n[1];
  tmp.n[2] = x->n[2];
  tmp.n[3] = x->n[3];
  tmp.n[4] = x->n[4];
  tmp.magnitude = x->magnitude;
  tmp.normalized = x->normalized;
  local_178[0] = x;
  secp256k1_fe_normalize_var(&tmp);
  secp256k1_fe_to_signed62(&local_b8,&tmp);
  d.v[2] = 0;
  d.v[3] = 0;
  d.v[0] = 0;
  d.v[1] = 0;
  d.v[4] = 0;
  local_90.v[3] = 0;
  local_90.v[4] = 0;
  local_90.v[1] = 0;
  local_90.v[2] = 0;
  local_90.v[0] = 1;
  f.v[2] = 0;
  f.v[3] = 0;
  f.v[0] = -0x1000003d1;
  f.v[1] = 0;
  f.v[4] = 0x100;
  g.v[4] = local_b8.v[4];
  g.v[2] = local_b8.v[2];
  g.v[3] = local_b8.v[3];
  g.v[0] = local_b8.v[0];
  g.v[1] = local_b8.v[1];
  iVar13 = 0;
  local_1ac = 5;
  local_1a8 = -1;
  do {
    iVar2 = g.v[0];
    iVar1 = f.v[0];
    lVar19 = 1;
    local_180 = 0;
    iVar20 = 0x3e;
    uVar17 = g.v[0];
    lVar14 = 0;
    local_1a0 = lVar19;
    local_188 = f.v[0];
    while( true ) {
      lVar21 = lVar14;
      uVar4 = secp256k1_ctz64_var(-1L << ((byte)iVar20 & 0x3f) | uVar17);
      psVar8 = (secp256k1_modinv64_modinfo *)(ulong)uVar4;
      local_1a8 = local_1a8 - (ulong)uVar4;
      bVar6 = (byte)uVar4;
      uVar16 = uVar17 >> (bVar6 & 0x3f);
      local_1a0 = local_1a0 << (bVar6 & 0x3f);
      local_180 = local_180 << (bVar6 & 0x3f);
      iVar20 = iVar20 - uVar4;
      if (iVar20 == 0) break;
      if ((local_188 & 1) == 0) {
        pcVar12 = 
        "/workspace/llm4binary/github/license_all_cmakelists_25/TheCharlatan[P]bitcoin/src/secp256k1/src/modinv64_impl.h"
        ;
        pcVar18 = "test condition failed: (f & 1) == 1";
        uVar10 = 0x101;
        goto LAB_00113144;
      }
      if ((uVar16 & 1) == 0) {
        pcVar12 = 
        "/workspace/llm4binary/github/license_all_cmakelists_25/TheCharlatan[P]bitcoin/src/secp256k1/src/modinv64_impl.h"
        ;
        pcVar18 = "test condition failed: (g & 1) == 1";
        uVar10 = 0x102;
        goto LAB_00113144;
      }
      bVar6 = 0x3e - (char)iVar20;
      if (local_180 * iVar2 + local_1a0 * iVar1 != local_188 << (bVar6 & 0x3f)) {
        pcVar12 = 
        "/workspace/llm4binary/github/license_all_cmakelists_25/TheCharlatan[P]bitcoin/src/secp256k1/src/modinv64_impl.h"
        ;
        pcVar18 = "test condition failed: (u * f0 + v * g0) == f << (62 - i)";
        uVar10 = 0x103;
        goto LAB_00113144;
      }
      if (lVar19 * iVar2 + lVar21 * iVar1 != uVar16 << (bVar6 & 0x3f)) {
        pcVar12 = 
        "/workspace/llm4binary/github/license_all_cmakelists_25/TheCharlatan[P]bitcoin/src/secp256k1/src/modinv64_impl.h"
        ;
        pcVar18 = "test condition failed: (q * f0 + r * g0) == g << (62 - i)";
        uVar10 = 0x104;
        goto LAB_00113144;
      }
      if (local_1a8 - 0x2eaU < 0xfffffffffffffa2d) {
        pcVar12 = 
        "/workspace/llm4binary/github/license_all_cmakelists_25/TheCharlatan[P]bitcoin/src/secp256k1/src/modinv64_impl.h"
        ;
        pcVar18 = "test condition failed: eta >= -745 && eta <= 745";
        uVar10 = 0x106;
        goto LAB_00113144;
      }
      iVar15 = (int)uVar16;
      if (local_1a8 < 0) {
        local_1a8 = -local_1a8;
        iVar7 = (int)local_1a8 + 1;
        if (iVar20 <= iVar7) {
          iVar7 = iVar20;
        }
        if (iVar7 - 0x3fU < 0xffffffc2) {
          pcVar12 = 
          "/workspace/llm4binary/github/license_all_cmakelists_25/TheCharlatan[P]bitcoin/src/secp256k1/src/modinv64_impl.h"
          ;
          pcVar18 = "test condition failed: limit > 0 && limit <= 62";
          uVar10 = 0x112;
          goto LAB_00113144;
        }
        lVar11 = -local_180;
        lVar14 = -local_1a0;
        uVar17 = -local_188;
        uVar5 = (ulong)(0x3fL << (-(char)iVar7 & 0x3fU)) >> (-(char)iVar7 & 0x3fU);
        uVar4 = (iVar15 * iVar15 + 0x3e) * iVar15 * (int)uVar17 & (uint)uVar5;
        local_180 = lVar19;
      }
      else {
        iVar7 = (int)local_1a8 + 1;
        if (iVar20 <= iVar7) {
          iVar7 = iVar20;
        }
        if (iVar7 - 0x3fU < 0xffffffc2) {
          pcVar12 = 
          "/workspace/llm4binary/github/license_all_cmakelists_25/TheCharlatan[P]bitcoin/src/secp256k1/src/modinv64_impl.h"
          ;
          pcVar18 = "test condition failed: limit > 0 && limit <= 62";
          uVar10 = 0x11c;
          goto LAB_00113144;
        }
        uVar5 = (ulong)(0xfL << (-(char)iVar7 & 0x3fU)) >> (-(char)iVar7 & 0x3fU);
        uVar4 = -(iVar15 * (((int)local_188 * 2 + 2U & 8) + (int)local_188)) & (uint)uVar5;
        uVar17 = uVar16;
        lVar14 = lVar21;
        lVar11 = lVar19;
        lVar21 = local_1a0;
        uVar16 = local_188;
      }
      uVar9 = (ulong)uVar4;
      uVar17 = uVar17 + uVar9 * uVar16;
      lVar19 = lVar11 + uVar9 * local_180;
      lVar14 = lVar21 * uVar9 + lVar14;
      local_1a0 = lVar21;
      local_188 = uVar16;
      if ((uVar17 & uVar5) != 0) {
        pcVar12 = 
        "/workspace/llm4binary/github/license_all_cmakelists_25/TheCharlatan[P]bitcoin/src/secp256k1/src/modinv64_impl.h"
        ;
        pcVar18 = "test condition failed: (g & m) == 0";
        uVar10 = 0x127;
        goto LAB_00113144;
      }
    }
    local_108.u = local_1a0;
    local_108.v = local_180;
    local_108.q = lVar21;
    local_108.r = lVar19;
    iVar20 = secp256k1_modinv64_det_check_pow2(&local_108,0x3e,0);
    if (iVar20 == 0) {
      pcVar12 = 
      "/workspace/llm4binary/github/license_all_cmakelists_25/TheCharlatan[P]bitcoin/src/secp256k1/src/modinv64_impl.h"
      ;
      pcVar18 = "test condition failed: secp256k1_modinv64_det_check_pow2(t, 62, 0)";
      uVar10 = 0x133;
      goto LAB_00113144;
    }
    secp256k1_modinv64_update_de_62(&d,&local_90,&local_108,psVar8);
    iVar20 = secp256k1_modinv64_mul_cmp_62(&f,local_1ac,&secp256k1_const_modinfo_fe.modulus,-1);
    if (iVar20 < 1) {
      pcVar12 = 
      "/workspace/llm4binary/github/license_all_cmakelists_25/TheCharlatan[P]bitcoin/src/secp256k1/src/modinv64_impl.h"
      ;
      pcVar18 = 
      "test condition failed: secp256k1_modinv64_mul_cmp_62(&f, len, &modinfo->modulus, -1) > 0";
      uVar10 = 0x292;
      goto LAB_00113144;
    }
    lVar14 = 1;
    iVar20 = secp256k1_modinv64_mul_cmp_62(&f,local_1ac,&secp256k1_const_modinfo_fe.modulus,1);
    if (0 < iVar20) {
      pcVar12 = 
      "/workspace/llm4binary/github/license_all_cmakelists_25/TheCharlatan[P]bitcoin/src/secp256k1/src/modinv64_impl.h"
      ;
      pcVar18 = 
      "test condition failed: secp256k1_modinv64_mul_cmp_62(&f, len, &modinfo->modulus, 1) <= 0";
      uVar10 = 0x293;
      goto LAB_00113144;
    }
    iVar20 = secp256k1_modinv64_mul_cmp_62(&g,local_1ac,&secp256k1_const_modinfo_fe.modulus,-1);
    if (iVar20 < 1) {
      pcVar12 = 
      "/workspace/llm4binary/github/license_all_cmakelists_25/TheCharlatan[P]bitcoin/src/secp256k1/src/modinv64_impl.h"
      ;
      pcVar18 = 
      "test condition failed: secp256k1_modinv64_mul_cmp_62(&g, len, &modinfo->modulus, -1) > 0";
      uVar10 = 0x294;
      goto LAB_00113144;
    }
    iVar20 = secp256k1_modinv64_mul_cmp_62(&g,local_1ac,&secp256k1_const_modinfo_fe.modulus,1);
    if (-1 < iVar20) {
      pcVar12 = 
      "/workspace/llm4binary/github/license_all_cmakelists_25/TheCharlatan[P]bitcoin/src/secp256k1/src/modinv64_impl.h"
      ;
      pcVar18 = 
      "test condition failed: secp256k1_modinv64_mul_cmp_62(&g, len, &modinfo->modulus, 1) < 0";
      uVar10 = 0x295;
      goto LAB_00113144;
    }
    secp256k1_modinv64_update_fg_62_var(local_1ac,&f,&g,&local_108);
    lVar19 = (long)local_1ac;
    if (g.v[0] == 0) {
      uVar17 = 0;
      for (; lVar14 < lVar19; lVar14 = lVar14 + 1) {
        uVar17 = uVar17 | g.v[lVar14];
      }
      if (uVar17 == 0) {
        iVar13 = secp256k1_modinv64_mul_cmp_62(&g,local_1ac,&SECP256K1_SIGNED62_ONE,0);
        if (iVar13 != 0) {
          pcVar12 = 
          "/workspace/llm4binary/github/license_all_cmakelists_25/TheCharlatan[P]bitcoin/src/secp256k1/src/modinv64_impl.h"
          ;
          pcVar18 = 
          "test condition failed: secp256k1_modinv64_mul_cmp_62(&g, len, &SECP256K1_SIGNED62_ONE, 0) == 0"
          ;
          uVar10 = 699;
          goto LAB_00113144;
        }
        iVar13 = secp256k1_modinv64_mul_cmp_62(&f,local_1ac,&SECP256K1_SIGNED62_ONE,-1);
        psVar8 = extraout_RDX;
        if (iVar13 != 0) {
          iVar13 = secp256k1_modinv64_mul_cmp_62(&f,local_1ac,&SECP256K1_SIGNED62_ONE,1);
          psVar8 = extraout_RDX_00;
          if (iVar13 != 0) {
            iVar13 = secp256k1_modinv64_mul_cmp_62(&local_b8,5,&SECP256K1_SIGNED62_ONE,0);
            if (iVar13 == 0) {
              iVar13 = secp256k1_modinv64_mul_cmp_62(&d,5,&SECP256K1_SIGNED62_ONE,0);
              if (iVar13 == 0) {
                iVar13 = secp256k1_modinv64_mul_cmp_62
                                   (&f,local_1ac,&secp256k1_const_modinfo_fe.modulus,1);
                psVar8 = extraout_RDX_01;
                if (iVar13 == 0) goto LAB_00113077;
              }
            }
            pcVar12 = 
            "/workspace/llm4binary/github/license_all_cmakelists_25/TheCharlatan[P]bitcoin/src/secp256k1/src/modinv64_impl.h"
            ;
            pcVar18 = 
            "test condition failed: secp256k1_modinv64_mul_cmp_62(&f, len, &SECP256K1_SIGNED62_ONE, -1) == 0 || secp256k1_modinv64_mul_cmp_62(&f, len, &SECP256K1_SIGNED62_ONE, 1) == 0 || (secp256k1_modinv64_mul_cmp_62(x, 5, &SECP256K1_SIGNED62_ONE, 0) == 0 && secp256k1_modinv64_mul_cmp_62(&d, 5, &SECP256K1_SIGNED62_ONE, 0) == 0 && secp256k1_modinv64_mul_cmp_62(&f, len, &modinfo->modulus, 1) == 0)"
            ;
            uVar10 = 0x2c1;
            goto LAB_00113144;
          }
        }
LAB_00113077:
        secp256k1_modinv64_normalize_62(&d,f.v[lVar19 + -1],psVar8);
        r_00 = local_178[1];
        local_b8.v[4] = d.v[4];
        local_b8.v[2] = d.v[2];
        local_b8.v[3] = d.v[3];
        local_b8.v[0] = d.v[0];
        local_b8.v[1] = d.v[1];
        secp256k1_fe_from_signed62(local_178[1],&local_b8);
        r_00->magnitude = (uint)(0 < local_178[0]->magnitude);
        r_00->normalized = 1;
        iVar13 = secp256k1_fe_normalizes_to_zero(r_00);
        if (iVar13 == iVar3) {
          secp256k1_fe_verify(r_00);
          return;
        }
        pcVar12 = 
        "/workspace/llm4binary/github/license_all_cmakelists_25/TheCharlatan[P]bitcoin/src/secp256k1/src/field_impl.h"
        ;
        pcVar18 = "test condition failed: secp256k1_fe_normalizes_to_zero(r) == input_is_zero";
        uVar10 = 0x19f;
        goto LAB_00113144;
      }
    }
    lVar14 = f.v[lVar19 + -1];
    lVar21 = g.v[lVar19 + -1];
    if (lVar21 >> 0x3f == lVar21 && (lVar14 >> 0x3f == lVar14 && -1 < lVar19 + -2)) {
      local_1ac = local_1ac + -1;
      local_178[lVar19] = (secp256k1_fe *)((ulong)local_178[lVar19] | lVar14 << 0x3e);
      f.v[lVar19 + 4] = f.v[lVar19 + 4] | lVar21 << 0x3e;
    }
    if (iVar13 == 0xb) {
      pcVar12 = 
      "/workspace/llm4binary/github/license_all_cmakelists_25/TheCharlatan[P]bitcoin/src/secp256k1/src/modinv64_impl.h"
      ;
      pcVar18 = "test condition failed: ++i < 12";
      uVar10 = 0x2b0;
      goto LAB_00113144;
    }
    iVar20 = secp256k1_modinv64_mul_cmp_62(&f,local_1ac,&secp256k1_const_modinfo_fe.modulus,-1);
    if (iVar20 < 1) {
      pcVar12 = 
      "/workspace/llm4binary/github/license_all_cmakelists_25/TheCharlatan[P]bitcoin/src/secp256k1/src/modinv64_impl.h"
      ;
      pcVar18 = 
      "test condition failed: secp256k1_modinv64_mul_cmp_62(&f, len, &modinfo->modulus, -1) > 0";
      uVar10 = 0x2b1;
      goto LAB_00113144;
    }
    iVar20 = secp256k1_modinv64_mul_cmp_62(&f,local_1ac,&secp256k1_const_modinfo_fe.modulus,1);
    if (0 < iVar20) {
      pcVar12 = 
      "/workspace/llm4binary/github/license_all_cmakelists_25/TheCharlatan[P]bitcoin/src/secp256k1/src/modinv64_impl.h"
      ;
      pcVar18 = 
      "test condition failed: secp256k1_modinv64_mul_cmp_62(&f, len, &modinfo->modulus, 1) <= 0";
      uVar10 = 0x2b2;
      goto LAB_00113144;
    }
    iVar20 = secp256k1_modinv64_mul_cmp_62(&g,local_1ac,&secp256k1_const_modinfo_fe.modulus,-1);
    if (iVar20 < 1) {
      pcVar12 = 
      "/workspace/llm4binary/github/license_all_cmakelists_25/TheCharlatan[P]bitcoin/src/secp256k1/src/modinv64_impl.h"
      ;
      pcVar18 = 
      "test condition failed: secp256k1_modinv64_mul_cmp_62(&g, len, &modinfo->modulus, -1) > 0";
      uVar10 = 0x2b3;
      goto LAB_00113144;
    }
    iVar20 = secp256k1_modinv64_mul_cmp_62(&g,local_1ac,&secp256k1_const_modinfo_fe.modulus,1);
    if (-1 < iVar20) {
      pcVar12 = 
      "/workspace/llm4binary/github/license_all_cmakelists_25/TheCharlatan[P]bitcoin/src/secp256k1/src/modinv64_impl.h"
      ;
      pcVar18 = 
      "test condition failed: secp256k1_modinv64_mul_cmp_62(&g, len, &modinfo->modulus, 1) < 0";
      uVar10 = 0x2b4;
LAB_00113144:
      fprintf(_stderr,"%s:%d: %s\n",pcVar12,uVar10,pcVar18);
      abort();
    }
    iVar13 = iVar13 + 1;
  } while( true );
}

Assistant:

SECP256K1_INLINE static void secp256k1_fe_inv_var(secp256k1_fe *r, const secp256k1_fe *x) {
    int input_is_zero = secp256k1_fe_normalizes_to_zero(x);
    SECP256K1_FE_VERIFY(x);

    secp256k1_fe_impl_inv_var(r, x);
    r->magnitude = x->magnitude > 0;
    r->normalized = 1;

    VERIFY_CHECK(secp256k1_fe_normalizes_to_zero(r) == input_is_zero);
    SECP256K1_FE_VERIFY(r);
}